

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::CommandRunner::OnAssertExhaustionCommand
          (CommandRunner *this,AssertExhaustionCommand *command)

{
  pointer pcVar1;
  int iVar2;
  Enum EVar3;
  ActionResult result;
  ActionResult local_90;
  long *local_48 [2];
  long local_38 [2];
  
  RunAction(&local_90,this,(command->super_CommandMixin<(wabt::CommandType)10>).super_Command.line,
            &command->action,Quiet);
  if (local_90.trap.obj_ != (Trap *)0x0) {
    pcVar1 = ((local_90.trap.obj_)->message_)._M_dataplus._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + ((local_90.trap.obj_)->message_)._M_string_length)
    ;
    iVar2 = std::__cxx11::string::compare((char *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    if (iVar2 == 0) {
      EVar3 = Ok;
      goto LAB_0012815a;
    }
  }
  PrintError(this,(command->super_CommandMixin<(wabt::CommandType)10>).super_Command.line,
             "expected trap: \"%s\"",(command->text)._M_dataplus._M_p);
  EVar3 = Error;
LAB_0012815a:
  if (local_90.trap.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_90.trap.store_,local_90.trap.root_index_);
    local_90.trap.obj_ = (Trap *)0x0;
    local_90.trap.store_ = (Store *)0x0;
    local_90.trap.root_index_ = 0;
  }
  if (local_90.values.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.values.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)EVar3;
}

Assistant:

wabt::Result CommandRunner::OnAssertExhaustionCommand(
    const AssertExhaustionCommand* command) {
  ActionResult result =
      RunAction(command->line, &command->action, RunVerbosity::Quiet);
  if (!result.trap || result.trap->message() != "call stack exhausted") {
    PrintError(command->line, "expected trap: \"%s\"", command->text.c_str());
    return wabt::Result::Error;
  }

  // TODO: print message when assertion passes.
#if 0
  PrintError(command->line, "assert_exhaustion passed: %s",
             result.trap->message().c_str());
#endif
  return wabt::Result::Ok;
}